

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::write
          (HttpChunkedEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  HttpEntityBodyWriter *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  long *plVar3;
  PromiseNode *pPVar4;
  undefined1 *puVar5;
  undefined4 in_register_00000034;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Promise<void> promise;
  String header;
  Array<kj::ArrayPtr<const_unsigned_char>_> parts;
  undefined1 local_88 [24];
  PromiseNode *pPStack_70;
  undefined8 *local_68;
  undefined1 local_58 [32];
  ArrayPtr<const_char> local_38;
  
  if (__n == 0) {
    kj::_::readyNow();
  }
  else {
    hex((CappedArray<char,_17UL> *)local_58,__n);
    local_88._0_8_ = local_58 + 8;
    local_88._8_8_ = local_58._0_8_;
    local_38.ptr = "\r\n";
    local_38.size_ = 2;
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)(local_88 + 0x10),(_ *)local_88,&local_38,
               (ArrayPtr<const_char> *)local_58._0_8_);
    plVar3 = (long *)kj::_::HeapArrayDisposer::allocateImpl
                               (0x10,3,3,kj::_::HeapArrayDisposer::
                                         Allocate_<kj::ArrayPtr<const_unsigned_char>_>::construct,
                                ArrayDisposer::Dispose_<kj::ArrayPtr<const_unsigned_char>_>::
                                destruct);
    local_58[8] = '\x03';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58._16_8_ = &kj::_::HeapArrayDisposer::instance;
    pPVar4 = pPStack_70;
    if (pPStack_70 != (PromiseNode *)0x0) {
      pPVar4 = (PromiseNode *)local_88._16_8_;
    }
    puVar5 = (undefined1 *)0x0;
    if (pPStack_70 != (PromiseNode *)0x0) {
      puVar5 = (undefined1 *)((long)&pPStack_70[-1].super_PromiseArenaMember.arena + 7);
    }
    *plVar3 = (long)pPVar4;
    plVar3[1] = (long)puVar5;
    plVar3[2] = (long)__buf;
    plVar3[3] = __n;
    plVar3[4] = (long)&kj::_::ByteLiteral<3ul>;
    plVar3[5] = 2;
    this_00 = *(HttpEntityBodyWriter **)(CONCAT44(in_register_00000034,__fd) + 8);
    local_58._0_8_ = plVar3;
    HttpEntityBodyWriter::getInner(this_00);
    pieces.size_ = (size_t)plVar3;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)this_00;
    HttpOutputStream::writeBodyData((HttpOutputStream *)local_88,pieces);
    Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
              ((Promise<void> *)this,(String *)local_88,
               (Array<kj::ArrayPtr<const_unsigned_char>_> *)(local_88 + 0x10));
    uVar1 = local_88._0_8_;
    if ((Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)local_88._0_8_ !=
        (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0) {
      local_88._0_8_ = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
    }
    uVar2 = local_58._8_8_;
    uVar1 = local_58._0_8_;
    if ((long *)local_58._0_8_ != (long *)0x0) {
      local_58._0_8_ = (long *)0x0;
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      (*(code *)**(undefined8 **)local_58._16_8_)(local_58._16_8_,uVar1,0x10,uVar2,uVar2,0);
    }
    pPVar4 = pPStack_70;
    uVar1 = local_88._16_8_;
    if ((PromiseNode *)local_88._16_8_ != (PromiseNode *)0x0) {
      local_88._16_8_ = (PromiseNode *)0x0;
      pPStack_70 = (PromiseNode *)0x0;
      (**(code **)*local_68)(local_68,uVar1,1,pPVar4,pPVar4,0);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) return kj::READY_NOW;  // can't encode zero-size chunk since it indicates EOF.

    auto header = kj::str(kj::hex(buffer.size()), "\r\n");
    auto parts = kj::heapArray<ArrayPtr<const byte>>(3);
    parts[0] = header.asBytes();
    parts[1] = buffer;
    parts[2] = "\r\n"_kjb;

    auto promise = getInner().writeBodyData(parts.asPtr());
    return promise.attach(kj::mv(header), kj::mv(parts));
  }